

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::TextureCubeFormatCase::testFace(TextureCubeFormatCase *this,CubeFace face)

{
  int preferredHeight;
  code *pcVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  RGBA threshold_00;
  undefined4 extraout_var;
  TestLog *this_00;
  undefined4 extraout_var_00;
  char *str;
  undefined4 extraout_var_01;
  PixelFormat *pPVar7;
  TextureCube *pTVar8;
  TextureFormat *pTVar9;
  MessageBuilder *this_01;
  reference pvVar10;
  undefined4 extraout_var_02;
  TextureCubeView local_3c8;
  SurfaceAccess local_390;
  PixelBufferAccess local_370;
  MessageBuilder local_348;
  Vector<float,_4> local_1c4;
  Sampler local_1b4;
  TextureFormat local_178;
  undefined1 local_16c [8];
  TextureFormatInfo spec;
  ReferenceParams renderParams;
  vector<float,_std::allocator<float>_> texCoord;
  RGBA threshold;
  undefined1 local_68 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  TestLog *log;
  Functions *gl;
  TextureCubeFormatCase *pTStack_10;
  CubeFace face_local;
  TextureCubeFormatCase *this_local;
  long lVar6;
  
  gl._4_4_ = face;
  pTStack_10 = this;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar4 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = this->m_width;
  preferredHeight = this->m_height;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(str);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar3,preferredHeight,dVar5 + gl._4_4_)
  ;
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_68,viewport.x,viewport.y);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar7 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = tcu::PixelFormat::getColorThreshold(pPVar7);
  tcu::RGBA::RGBA((RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,1,1,1,1);
  threshold_00 = tcu::operator+((RGBA *)((long)&texCoord.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),
                                (RGBA *)&texCoord.super__Vector_base<float,_std::allocator<float>_>.
                                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)(spec.lookupBias.m_data + 2),TEXTURETYPE_CUBE);
  pTVar8 = glu::TextureCube::getRefTexture(this->m_texture);
  pTVar9 = tcu::TextureCube::getFormat(pTVar8);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_16c,pTVar9);
  pTVar8 = glu::TextureCube::getRefTexture(this->m_texture);
  pTVar9 = tcu::TextureCube::getFormat(pTVar8);
  local_178 = *pTVar9;
  spec.lookupBias.m_data[3] = (float)glu::TextureTestUtil::getSamplerType(local_178);
  tcu::Vector<float,_4>::Vector(&local_1c4,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (&local_1b4,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,true,
             COMPAREMODE_NONE,0,&local_1c4,false,MODE_DEPTH);
  tcu::Sampler::operator=
            ((Sampler *)(renderParams.super_RenderParams.colorBias.m_data + 2),&local_1b4);
  renderParams.sampler.borderColor.v.uData[2]._0_1_ = 0;
  renderParams.super_RenderParams.bias = spec.valueMax.m_data[2];
  renderParams.super_RenderParams.ref = spec.valueMax.m_data[3];
  renderParams.super_RenderParams.colorScale.m_data[0] = spec.lookupScale.m_data[0];
  renderParams.super_RenderParams.colorScale.m_data[1] = spec.lookupScale.m_data[1];
  renderParams.super_RenderParams.colorScale.m_data[2] = spec.lookupScale.m_data[2];
  renderParams.super_RenderParams.colorScale.m_data[3] = spec.lookupScale.m_data[3];
  renderParams.super_RenderParams.colorBias.m_data[0] = spec.lookupBias.m_data[0];
  renderParams.super_RenderParams.colorBias.m_data[1] = spec.lookupBias.m_data[1];
  if (gl._4_4_ == CUBEFACE_NEGATIVE_X) {
    renderParams.super_RenderParams.texType =
         renderParams.super_RenderParams.texType | (TEXTURETYPE_LAST|TEXTURETYPE_CUBE_ARRAY);
  }
  glu::TextureTestUtil::computeQuadTexCoordCube
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,gl._4_4_);
  tcu::TestLog::operator<<(&local_348,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_348,(CubeFace *)((long)&gl + 4));
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_348);
  (**(code **)(lVar6 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,viewport.x,
             viewport.y);
  (**(code **)(lVar6 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar5 = glu::TextureCube::getGLTexture(this->m_texture);
  (*pcVar1)(0x8513,dVar5);
  (**(code **)(lVar6 + 0x1360))(0x8513,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x8513,0x2803,0x812f);
  (**(code **)(lVar6 + 0x1360))(0x8513,0x2801,0x2600);
  (**(code **)(lVar6 + 0x1360))(0x8513,0x2800,0x2600);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x162);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar10,(RenderParams *)(spec.lookupBias.m_data + 2));
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_370,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(context,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                  &local_370);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x166);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar7 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar3));
  tcu::SurfaceAccess::SurfaceAccess(&local_390,(Surface *)local_68,pPVar7);
  pTVar8 = glu::TextureCube::getRefTexture(this->m_texture);
  tcu::TextureCube::operator_cast_to_TextureCubeView(&local_3c8,pTVar8);
  pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel,0);
  glu::TextureTestUtil::sampleTexture
            (&local_390,&local_3c8,pvVar10,(ReferenceParams *)(spec.lookupBias.m_data + 2));
  bVar2 = glu::TextureTestUtil::compareImages
                    (this_00,(Surface *)local_68,(Surface *)&referenceFrame.m_pixels.m_cap,
                     threshold_00);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&renderParams.baseLevel);
  tcu::Surface::~Surface((Surface *)local_68);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return bVar2;
}

Assistant:

bool TextureCubeFormatCase::testFace (tcu::CubeFace face)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_width, m_height, deStringHash(getName())+(deUint32)face);
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_CUBE);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	renderParams.samplerType				= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler					= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.sampler.seamlessCubeMap	= false;
	renderParams.colorScale					= spec.lookupScale;
	renderParams.colorBias					= spec.lookupBias;

	// Log render info on first face.
	if (face == tcu::CUBEFACE_NEGATIVE_X)
		renderParams.flags |= RenderParams::LOG_ALL;

	computeQuadTexCoordCube(texCoord, face);

	// \todo [2011-10-28 pyry] Image set name / section?
	log << TestLog::Message << face << TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	return compareImages(log, referenceFrame, renderedFrame, threshold);
}